

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.cpp
# Opt level: O2

void Diligent::anon_unknown_61::ValidatePipelineResourceLayoutDesc
               (PipelineStateDesc *PSODesc,DeviceFeatures *Features)

{
  ShaderResourceVariableDesc *pSVar1;
  uint uVar2;
  _Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
  _Var3;
  char *pcVar4;
  ShaderResourceVariableDesc *in_RCX;
  SHADER_TYPE ShaderStages;
  SHADER_TYPE ShaderStages_00;
  SHADER_TYPE ShaderStages_01;
  SHADER_TYPE ShaderStages_02;
  SHADER_TYPE ShaderStages_03;
  SHADER_TYPE ShaderStages_04;
  SHADER_TYPE ShaderStages_05;
  SHADER_TYPE ShaderStages_06;
  SHADER_TYPE *pSVar5;
  ImmutableSamplerDesc *pIVar6;
  pair<std::__detail::_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false,_false>_>
  pVar7;
  uint local_cc;
  ShaderResourceVariableDesc *local_c8;
  char *local_c0;
  char *local_b8;
  String local_b0;
  string msg;
  unordered_multimap<Diligent::HashMapStringKey,_Diligent::SHADER_TYPE,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>_>_>
  UniqueVariables;
  
  UniqueVariables._M_h._M_buckets = &UniqueVariables._M_h._M_single_bucket;
  UniqueVariables._M_h._M_bucket_count = 1;
  UniqueVariables._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  UniqueVariables._M_h._M_element_count = 0;
  UniqueVariables._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  UniqueVariables._M_h._M_rehash_policy._M_next_resize = 0;
  UniqueVariables._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_cc = 0;
  while( true ) {
    if ((PSODesc->ResourceLayout).NumVariables <= local_cc) break;
    in_RCX = (PSODesc->ResourceLayout).Variables;
    pSVar1 = in_RCX + local_cc;
    pcVar4 = in_RCX[local_cc].Name;
    if (pcVar4 == (char *)0x0) {
      msg._M_dataplus._M_p = GetPipelineTypeString(PSODesc->PipelineType);
      local_b0._M_dataplus._M_p = (PSODesc->super_DeviceObjectAttribs).Name;
      if (local_b0._M_dataplus._M_p == (char *)0x0) {
        local_b0._M_dataplus._M_p = "";
      }
      in_RCX = (ShaderResourceVariableDesc *)0x1d9;
      LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[26],unsigned_int,char[25]>
                (false,"ValidatePipelineResourceLayoutDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                 ,0x1d9,(char (*) [16])"Description of ",(char **)&msg,(char (*) [7])0x2b82c4,
                 (char **)&local_b0,(char (*) [15])"\' is invalid: ",
                 (char (*) [26])"ResourceLayout.Variables[",&local_cc,
                 (char (*) [25])"].Name must not be null.");
      pcVar4 = pSVar1->Name;
    }
    if (*pcVar4 == '\0') {
      msg._M_dataplus._M_p = GetPipelineTypeString(PSODesc->PipelineType);
      local_b0._M_dataplus._M_p = (PSODesc->super_DeviceObjectAttribs).Name;
      if (local_b0._M_dataplus._M_p == (char *)0x0) {
        local_b0._M_dataplus._M_p = "";
      }
      in_RCX = (ShaderResourceVariableDesc *)0x1dc;
      LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[26],unsigned_int,char[26]>
                (false,"ValidatePipelineResourceLayoutDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                 ,0x1dc,(char (*) [16])"Description of ",(char **)&msg,(char (*) [7])0x2b82c4,
                 (char **)&local_b0,(char (*) [15])"\' is invalid: ",
                 (char (*) [26])"ResourceLayout.Variables[",&local_cc,
                 (char (*) [26])"].Name must not be empty.");
    }
    if (pSVar1->ShaderStages == SHADER_TYPE_UNKNOWN) {
      msg._M_dataplus._M_p = GetPipelineTypeString(PSODesc->PipelineType);
      local_b0._M_dataplus._M_p = (PSODesc->super_DeviceObjectAttribs).Name;
      if (local_b0._M_dataplus._M_p == (char *)0x0) {
        local_b0._M_dataplus._M_p = "";
      }
      in_RCX = (ShaderResourceVariableDesc *)0x1df;
      LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[26],unsigned_int,char[48]>
                (false,"ValidatePipelineResourceLayoutDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                 ,0x1df,(char (*) [16])"Description of ",(char **)&msg,(char (*) [7])0x2b82c4,
                 (char **)&local_b0,(char (*) [15])"\' is invalid: ",
                 (char (*) [26])"ResourceLayout.Variables[",&local_cc,
                 (char (*) [48])"].ShaderStages must not be SHADER_TYPE_UNKNOWN.");
    }
    HashMapStringKey::HashMapStringKey((HashMapStringKey *)&msg,pSVar1->Name,false);
    pVar7 = std::
            _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
            ::equal_range(&UniqueVariables._M_h,(key_type *)&msg);
    pSVar5 = &pSVar1->ShaderStages;
    local_c8 = pSVar1;
    HashMapStringKey::Clear((HashMapStringKey *)&msg);
    for (_Var3._M_cur = (__node_type *)
                        pVar7.first.
                        super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
                        ._M_cur;
        (_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
         )_Var3._M_cur !=
        pVar7.second.
        super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
        ._M_cur.
        super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
        ; _Var3._M_cur = (__node_type *)((_Var3._M_cur)->super__Hash_node_base)._M_nxt) {
      if ((*(SHADER_TYPE *)
            ((long)&((_Var3._M_cur)->
                    super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
                    ).
                    super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>_>
                    ._M_storage._M_storage + 0x10) & *pSVar5) != SHADER_TYPE_UNKNOWN) {
        local_b8 = GetPipelineTypeString(PSODesc->PipelineType);
        local_c0 = (PSODesc->super_DeviceObjectAttribs).Name;
        if (local_c0 == (char *)0x0) {
          local_c0 = "";
        }
        GetShaderStagesString_abi_cxx11_(&msg,(Diligent *)(ulong)*pSVar5,ShaderStages);
        GetShaderStagesString_abi_cxx11_
                  (&local_b0,
                   (Diligent *)
                   (ulong)*(uint *)((long)&((_Var3._M_cur)->
                                           super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
                                           ).
                                           super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>_>
                                           ._M_storage._M_storage + 0x10),ShaderStages_00);
        in_RCX = (ShaderResourceVariableDesc *)0x1e8;
        LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[18],char_const*,char[44],std::__cxx11::string,char[6],std::__cxx11::string,char[99]>
                  (false,"ValidatePipelineResourceLayoutDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                   ,0x1e8,(char (*) [16])"Description of ",&local_b8,(char (*) [7])0x2b82c4,
                   &local_c0,(char (*) [15])"\' is invalid: ",(char (*) [18])"Shader variable \'",
                   &local_c8->Name,(char (*) [44])"\' is defined in overlapping shader stages (",
                   &msg,(char (*) [6])" and ",&local_b0,
                   (char (*) [99])
                   "). Multiple variables with the same name are allowed, but shader stages they use must not overlap."
                  );
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&msg);
      }
      if (Features->SeparablePrograms == DEVICE_FEATURE_STATE_DISABLED) {
        if (*(int *)((long)&((_Var3._M_cur)->
                            super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
                            ).
                            super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>_>
                            ._M_storage._M_storage + 0x10) == 0) {
          FormatString<char[26],char[34]>
                    (&msg,(Diligent *)"Debug expression failed:\n",
                     (char (*) [26])"it->second != SHADER_TYPE_UNKNOWN",(char (*) [34])in_RCX);
          DebugAssertionFailed
                    (msg._M_dataplus._M_p,"ValidatePipelineResourceLayoutDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                     ,0x1ec);
          std::__cxx11::string::~string((string *)&msg);
        }
        local_b8 = GetPipelineTypeString(PSODesc->PipelineType);
        local_c0 = (PSODesc->super_DeviceObjectAttribs).Name;
        if (local_c0 == (char *)0x0) {
          local_c0 = "";
        }
        GetShaderStagesString_abi_cxx11_(&msg,(Diligent *)(ulong)*pSVar5,ShaderStages_01);
        GetShaderStagesString_abi_cxx11_
                  (&local_b0,
                   (Diligent *)
                   (ulong)*(uint *)((long)&((_Var3._M_cur)->
                                           super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
                                           ).
                                           super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>_>
                                           ._M_storage._M_storage + 0x10),ShaderStages_02);
        in_RCX = (ShaderResourceVariableDesc *)0x1f2;
        LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[98],char_const*,char[20],std::__cxx11::string,char[6],std::__cxx11::string,char[184]>
                  (false,"ValidatePipelineResourceLayoutDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                   ,0x1f2,(char (*) [16])"Description of ",&local_b8,(char (*) [7])0x2b82c4,
                   &local_c0,(char (*) [15])"\' is invalid: ",
                   (char (*) [98])
                   "This device does not support separable programs, but there are separate resources with the name \'"
                   ,&local_c8->Name,(char (*) [20])"\' in shader stages ",&msg,(char (*) [6])" and "
                   ,&local_b0,(char (*) [184])0x2e96ff);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&msg);
      }
    }
    std::
    _Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,Diligent::SHADER_TYPE>,std::allocator<std::pair<Diligent::HashMapStringKey_const,Diligent::SHADER_TYPE>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
    ::_M_emplace<char_const*const&,Diligent::SHADER_TYPE_const&>
              ((_Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,Diligent::SHADER_TYPE>,std::allocator<std::pair<Diligent::HashMapStringKey_const,Diligent::SHADER_TYPE>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
                *)&UniqueVariables,local_c8,pSVar5);
    local_cc = local_cc + 1;
  }
  std::
  _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
  ::~_Hashtable(&UniqueVariables._M_h);
  UniqueVariables._M_h._M_buckets = &UniqueVariables._M_h._M_single_bucket;
  UniqueVariables._M_h._M_bucket_count = 1;
  UniqueVariables._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  UniqueVariables._M_h._M_element_count = 0;
  UniqueVariables._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  UniqueVariables._M_h._M_rehash_policy._M_next_resize = 0;
  UniqueVariables._M_h._M_single_bucket = (__node_base_ptr)0x0;
  uVar2 = 0;
  while( true ) {
    local_cc = uVar2;
    if ((PSODesc->ResourceLayout).NumImmutableSamplers <= uVar2) break;
    pIVar6 = (PSODesc->ResourceLayout).ImmutableSamplers;
    local_c8 = (ShaderResourceVariableDesc *)&pIVar6[uVar2].SamplerOrTextureName;
    pcVar4 = *(char **)local_c8;
    if (pcVar4 == (char *)0x0) {
      msg._M_dataplus._M_p = GetPipelineTypeString(PSODesc->PipelineType);
      local_b0._M_dataplus._M_p = (PSODesc->super_DeviceObjectAttribs).Name;
      if (local_b0._M_dataplus._M_p == (char *)0x0) {
        local_b0._M_dataplus._M_p = "";
      }
      in_RCX = (ShaderResourceVariableDesc *)0x1ff;
      LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[34],unsigned_int,char[41]>
                (false,"ValidatePipelineResourceLayoutDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                 ,0x1ff,(char (*) [16])"Description of ",(char **)&msg,(char (*) [7])0x2b82c4,
                 (char **)&local_b0,(char (*) [15])"\' is invalid: ",
                 (char (*) [34])"ResourceLayout.ImmutableSamplers[",&local_cc,
                 (char (*) [41])"].SamplerOrTextureName must not be null.");
      pcVar4 = local_c8->Name;
    }
    if (*pcVar4 == '\0') {
      msg._M_dataplus._M_p = GetPipelineTypeString(PSODesc->PipelineType);
      local_b0._M_dataplus._M_p = (PSODesc->super_DeviceObjectAttribs).Name;
      if (local_b0._M_dataplus._M_p == (char *)0x0) {
        local_b0._M_dataplus._M_p = "";
      }
      in_RCX = (ShaderResourceVariableDesc *)0x202;
      LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[34],unsigned_int,char[42]>
                (false,"ValidatePipelineResourceLayoutDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                 ,0x202,(char (*) [16])"Description of ",(char **)&msg,(char (*) [7])0x2b82c4,
                 (char **)&local_b0,(char (*) [15])"\' is invalid: ",
                 (char (*) [34])"ResourceLayout.ImmutableSamplers[",&local_cc,
                 (char (*) [42])"].SamplerOrTextureName must not be empty.");
    }
    pIVar6 = pIVar6 + uVar2;
    if (pIVar6->ShaderStages == SHADER_TYPE_UNKNOWN) {
      msg._M_dataplus._M_p = GetPipelineTypeString(PSODesc->PipelineType);
      local_b0._M_dataplus._M_p = (PSODesc->super_DeviceObjectAttribs).Name;
      if (local_b0._M_dataplus._M_p == (char *)0x0) {
        local_b0._M_dataplus._M_p = "";
      }
      in_RCX = (ShaderResourceVariableDesc *)0x205;
      LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[34],unsigned_int,char[48]>
                (false,"ValidatePipelineResourceLayoutDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                 ,0x205,(char (*) [16])"Description of ",(char **)&msg,(char (*) [7])0x2b82c4,
                 (char **)&local_b0,(char (*) [15])"\' is invalid: ",
                 (char (*) [34])"ResourceLayout.ImmutableSamplers[",&local_cc,
                 (char (*) [48])"].ShaderStages must not be SHADER_TYPE_UNKNOWN.");
    }
    HashMapStringKey::HashMapStringKey((HashMapStringKey *)&msg,local_c8->Name,false);
    pVar7 = std::
            _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
            ::equal_range(&UniqueVariables._M_h,(key_type *)&msg);
    HashMapStringKey::Clear((HashMapStringKey *)&msg);
    for (_Var3._M_cur = (__node_type *)
                        pVar7.first.
                        super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
                        ._M_cur;
        (_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
         )_Var3._M_cur !=
        pVar7.second.
        super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
        ._M_cur.
        super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
        ; _Var3._M_cur = (__node_type *)((_Var3._M_cur)->super__Hash_node_base)._M_nxt) {
      if ((*(SHADER_TYPE *)
            ((long)&((_Var3._M_cur)->
                    super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
                    ).
                    super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>_>
                    ._M_storage._M_storage + 0x10) & pIVar6->ShaderStages) != SHADER_TYPE_UNKNOWN) {
        local_b8 = GetPipelineTypeString(PSODesc->PipelineType);
        local_c0 = (PSODesc->super_DeviceObjectAttribs).Name;
        if (local_c0 == (char *)0x0) {
          local_c0 = "";
        }
        GetShaderStagesString_abi_cxx11_
                  (&msg,(Diligent *)(ulong)pIVar6->ShaderStages,ShaderStages_03);
        GetShaderStagesString_abi_cxx11_
                  (&local_b0,
                   (Diligent *)
                   (ulong)*(uint *)((long)&((_Var3._M_cur)->
                                           super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
                                           ).
                                           super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>_>
                                           ._M_storage._M_storage + 0x10),ShaderStages_04);
        in_RCX = (ShaderResourceVariableDesc *)0x20e;
        LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[20],char_const*,char[44],std::__cxx11::string,char[6],std::__cxx11::string,char[108]>
                  (false,"ValidatePipelineResourceLayoutDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                   ,0x20e,(char (*) [16])"Description of ",&local_b8,(char (*) [7])0x2b82c4,
                   &local_c0,(char (*) [15])"\' is invalid: ",(char (*) [20])"Immutable sampler \'",
                   &local_c8->Name,(char (*) [44])"\' is defined in overlapping shader stages (",
                   &msg,(char (*) [6])" and ",&local_b0,
                   (char (*) [108])
                   "). Multiple immutable samplers with the same name are allowed, but shader stages they use must not overlap."
                  );
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&msg);
      }
      if (Features->SeparablePrograms == DEVICE_FEATURE_STATE_DISABLED) {
        if (*(int *)((long)&((_Var3._M_cur)->
                            super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
                            ).
                            super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>_>
                            ._M_storage._M_storage + 0x10) == 0) {
          FormatString<char[26],char[34]>
                    (&msg,(Diligent *)"Debug expression failed:\n",
                     (char (*) [26])"it->second != SHADER_TYPE_UNKNOWN",(char (*) [34])in_RCX);
          DebugAssertionFailed
                    (msg._M_dataplus._M_p,"ValidatePipelineResourceLayoutDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                     ,0x212);
          std::__cxx11::string::~string((string *)&msg);
        }
        local_b8 = GetPipelineTypeString(PSODesc->PipelineType);
        local_c0 = (PSODesc->super_DeviceObjectAttribs).Name;
        if (local_c0 == (char *)0x0) {
          local_c0 = "";
        }
        GetShaderStagesString_abi_cxx11_
                  (&msg,(Diligent *)(ulong)pIVar6->ShaderStages,ShaderStages_05);
        GetShaderStagesString_abi_cxx11_
                  (&local_b0,
                   (Diligent *)
                   (ulong)*(uint *)((long)&((_Var3._M_cur)->
                                           super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
                                           ).
                                           super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>_>
                                           ._M_storage._M_storage + 0x10),ShaderStages_06);
        in_RCX = (ShaderResourceVariableDesc *)0x218;
        LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[107],char_const*,char[20],std::__cxx11::string,char[6],std::__cxx11::string,char[192]>
                  (false,"ValidatePipelineResourceLayoutDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                   ,0x218,(char (*) [16])"Description of ",&local_b8,(char (*) [7])0x2b82c4,
                   &local_c0,(char (*) [15])"\' is invalid: ",
                   (char (*) [107])
                   "This device does not support separable programs, but there are separate immutable samplers with the name \'"
                   ,&local_c8->Name,(char (*) [20])"\' in shader stages ",&msg,(char (*) [6])" and "
                   ,&local_b0,
                   (char (*) [192])
                   ". When separable programs are not supported, every resource is always shared between all stages. Use distinct immutable sampler names for each stage or define a single sampler for all stages."
                  );
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&msg);
      }
    }
    std::
    _Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,Diligent::SHADER_TYPE>,std::allocator<std::pair<Diligent::HashMapStringKey_const,Diligent::SHADER_TYPE>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
    ::_M_emplace<char_const*const&,Diligent::SHADER_TYPE_const&>
              ((_Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,Diligent::SHADER_TYPE>,std::allocator<std::pair<Diligent::HashMapStringKey_const,Diligent::SHADER_TYPE>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
                *)&UniqueVariables,local_c8,pIVar6);
    uVar2 = local_cc + 1;
  }
  std::
  _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
  ::~_Hashtable(&UniqueVariables._M_h);
  return;
}

Assistant:

void ValidatePipelineResourceLayoutDesc(const PipelineStateDesc& PSODesc, const DeviceFeatures& Features) noexcept(false)
{
    const PipelineResourceLayoutDesc& Layout = PSODesc.ResourceLayout;
    {
        std::unordered_multimap<HashMapStringKey, SHADER_TYPE> UniqueVariables;
        for (Uint32 i = 0; i < Layout.NumVariables; ++i)
        {
            const ShaderResourceVariableDesc& Var = Layout.Variables[i];

            if (Var.Name == nullptr)
                LOG_PSO_ERROR_AND_THROW("ResourceLayout.Variables[", i, "].Name must not be null.");

            if (Var.Name[0] == '\0')
                LOG_PSO_ERROR_AND_THROW("ResourceLayout.Variables[", i, "].Name must not be empty.");

            if (Var.ShaderStages == SHADER_TYPE_UNKNOWN)
                LOG_PSO_ERROR_AND_THROW("ResourceLayout.Variables[", i, "].ShaderStages must not be SHADER_TYPE_UNKNOWN.");

            auto range = UniqueVariables.equal_range(Var.Name);
            for (auto it = range.first; it != range.second; ++it)
            {
                if ((it->second & Var.ShaderStages) != 0)
                {
                    LOG_PSO_ERROR_AND_THROW("Shader variable '", Var.Name, "' is defined in overlapping shader stages (", GetShaderStagesString(Var.ShaderStages),
                                            " and ", GetShaderStagesString(it->second),
                                            "). Multiple variables with the same name are allowed, but shader stages they use must not overlap.");
                }
                if (Features.SeparablePrograms == DEVICE_FEATURE_STATE_DISABLED)
                {
                    VERIFY_EXPR(it->second != SHADER_TYPE_UNKNOWN);
                    LOG_PSO_ERROR_AND_THROW("This device does not support separable programs, but there are separate resources with the name '",
                                            Var.Name, "' in shader stages ",
                                            GetShaderStagesString(Var.ShaderStages), " and ",
                                            GetShaderStagesString(it->second),
                                            ". When separable programs are not supported, every resource is always shared between all stages. "
                                            "Use distinct resource names for each stage or define a single resource for all stages.");
                }
            }
            UniqueVariables.emplace(Var.Name, Var.ShaderStages);
        }
    }
    {
        std::unordered_multimap<HashMapStringKey, SHADER_TYPE> UniqueSamplers;
        for (Uint32 i = 0; i < Layout.NumImmutableSamplers; ++i)
        {
            const ImmutableSamplerDesc& Sam = Layout.ImmutableSamplers[i];

            if (Sam.SamplerOrTextureName == nullptr)
                LOG_PSO_ERROR_AND_THROW("ResourceLayout.ImmutableSamplers[", i, "].SamplerOrTextureName must not be null.");

            if (Sam.SamplerOrTextureName[0] == '\0')
                LOG_PSO_ERROR_AND_THROW("ResourceLayout.ImmutableSamplers[", i, "].SamplerOrTextureName must not be empty.");

            if (Sam.ShaderStages == SHADER_TYPE_UNKNOWN)
                LOG_PSO_ERROR_AND_THROW("ResourceLayout.ImmutableSamplers[", i, "].ShaderStages must not be SHADER_TYPE_UNKNOWN.");

            auto range = UniqueSamplers.equal_range(Sam.SamplerOrTextureName);
            for (auto it = range.first; it != range.second; ++it)
            {
                if ((it->second & Sam.ShaderStages) != 0)
                {
                    LOG_PSO_ERROR_AND_THROW("Immutable sampler '", Sam.SamplerOrTextureName, "' is defined in overlapping shader stages (", GetShaderStagesString(Sam.ShaderStages),
                                            " and ", GetShaderStagesString(it->second),
                                            "). Multiple immutable samplers with the same name are allowed, but shader stages they use must not overlap.");
                }
                if (Features.SeparablePrograms == DEVICE_FEATURE_STATE_DISABLED)
                {
                    VERIFY_EXPR(it->second != SHADER_TYPE_UNKNOWN);
                    LOG_PSO_ERROR_AND_THROW("This device does not support separable programs, but there are separate immutable samplers with the name '",
                                            Sam.SamplerOrTextureName, "' in shader stages ",
                                            GetShaderStagesString(Sam.ShaderStages), " and ",
                                            GetShaderStagesString(it->second),
                                            ". When separable programs are not supported, every resource is always shared between all stages. "
                                            "Use distinct immutable sampler names for each stage or define a single sampler for all stages.");
                }
            }
            UniqueSamplers.emplace(Sam.SamplerOrTextureName, Sam.ShaderStages);
        }
    }
}